

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void set_filename(char *c)

{
  undefined8 local_18;
  char *c_local;
  
  if (filename != (char *)0x0) {
    free(filename);
  }
  if (c == (char *)0x0) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = strdup(c);
  }
  filename = local_18;
  if ((local_18 != (char *)0x0) && (batch_mode == 0)) {
    update_history(local_18);
  }
  set_modflag(modflag);
  return;
}

Assistant:

void set_filename(const char *c) {
  if (filename) free((void *)filename);
  filename = c ? strdup(c) : NULL;

  if (filename && !batch_mode)
    update_history(filename);

  set_modflag(modflag);
}